

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O3

qsizetype bm_find(QStringView haystack,qsizetype index,QStringView needle,uchar *skiptable,
                 CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  storage_type_conflict *psVar7;
  storage_type_conflict *psVar8;
  storage_type_conflict *psVar9;
  qsizetype qVar10;
  short sVar11;
  storage_type_conflict *psVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long in_FS_OFFSET;
  QStringView s;
  char16_t foldBuffer [256];
  QStringView local_248;
  ushort local_238 [256];
  long local_38;
  
  lVar13 = haystack.m_size;
  psVar12 = haystack.m_data;
  uVar16 = needle.m_size;
  psVar7 = needle.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar16 == 0) {
    qVar10 = -1;
    if (index <= lVar13) {
      qVar10 = index;
    }
  }
  else {
    psVar1 = psVar12 + lVar13;
    if (cs == CaseSensitive) {
      qVar10 = -1;
      psVar8 = psVar12 + index + (uVar16 - 1);
      do {
        if (psVar1 <= psVar8) break;
        uVar14 = (ulong)skiptable[(byte)*psVar8];
        if (uVar14 == 0) {
          if ((long)uVar16 < 1) {
LAB_0011df20:
            qVar10 = ((long)psVar8 - (long)psVar12 >> 1) - (uVar16 - 1);
            break;
          }
          lVar13 = 0;
          while (psVar8[lVar13] == psVar7[uVar16 + lVar13 + -1]) {
            lVar13 = lVar13 + -1;
            if (uVar16 + lVar13 == 0) goto LAB_0011df20;
          }
          uVar14 = lVar13 + uVar16;
          if (skiptable[(byte)psVar8[lVar13]] != uVar16) {
            uVar14 = 1;
          }
        }
        bVar4 = psVar8 <= psVar1 + -uVar14;
        psVar8 = psVar8 + uVar14;
      } while (bVar4);
    }
    else {
      memset(local_238,0xaa,0x200);
      uVar14 = 0x100;
      if ((long)uVar16 < 0x100) {
        uVar14 = uVar16;
      }
      if (0 < (long)uVar16) {
        uVar5 = 0;
        do {
          sVar2 = psVar7[uVar5];
          uVar15 = (uint)(ushort)sVar2;
          if (((uVar5 != 0) && (((ushort)sVar2 & 0xfc00) == 0xdc00)) &&
             ((psVar7[uVar5 - 1] & 0xfc00U) == 0xd800)) {
            uVar15 = (uint)(ushort)sVar2 + (uint)(ushort)psVar7[uVar5 - 1] * 0x400 + 0xfca02400;
          }
          uVar18 = 0xff;
          if (uVar15 < 0x11000) {
            uVar18 = 0x1f;
          }
          uVar3 = uVar15 >> 5;
          if (0x10fff < uVar15) {
            uVar3 = (uVar15 - 0x11000 >> 8) + 0x880;
          }
          uVar17 = (uint)(int)(short)*(ushort *)
                                      (QUnicodeTables::uc_properties +
                                      (ulong)*(ushort *)
                                              (QUnicodeTables::uc_property_trie +
                                              (ulong)((uVar18 & uVar15) +
                                                     (uint)*(ushort *)
                                                            (QUnicodeTables::uc_property_trie +
                                                            (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >>
                   1;
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar18 & uVar15) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2) *
                0x14 + 0xe) & 1) == 0) {
            uVar15 = uVar15 + (uVar17 & 0xffff);
          }
          else {
            lVar6 = (long)(short)uVar17;
            if (*(short *)(QUnicodeTables::specialCaseMap + lVar6 * 2) == 1) {
              uVar15 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar6 * 2 + 2);
            }
          }
          local_238[uVar5] = (ushort)uVar15;
          uVar5 = uVar5 + 1;
        } while (uVar14 != uVar5);
      }
      psVar8 = psVar12 + index + (uVar14 - 1);
      do {
        if (psVar1 <= psVar8) break;
        sVar2 = *psVar8;
        uVar15 = (uint)(ushort)sVar2;
        if (((psVar12 <= psVar8 && (long)psVar8 - (long)psVar12 != 0) &&
             ((ushort)sVar2 & 0xfc00) == 0xdc00) && ((psVar8[-1] & 0xfc00U) == 0xd800)) {
          uVar15 = (uint)(ushort)sVar2 + (uint)(ushort)psVar8[-1] * 0x400 + 0xfca02400;
        }
        uVar18 = 0xff;
        if (uVar15 < 0x11000) {
          uVar18 = 0x1f;
        }
        uVar3 = uVar15 >> 5;
        if (0x10fff < uVar15) {
          uVar3 = (uVar15 - 0x11000 >> 8) + 0x880;
        }
        uVar17 = (uint)(int)(short)*(ushort *)
                                    (QUnicodeTables::uc_properties +
                                    (ulong)*(ushort *)
                                            (QUnicodeTables::uc_property_trie +
                                            (ulong)((uVar18 & uVar15) +
                                                   (uint)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >> 1
        ;
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)((uVar18 & uVar15) +
                             (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2))
                      * 2) * 0x14 + 0xe) & 1) == 0) {
          uVar15 = uVar15 + (uVar17 & 0xffff);
        }
        else {
          lVar6 = (long)(short)uVar17;
          if (*(short *)(QUnicodeTables::specialCaseMap + lVar6 * 2) == 1) {
            uVar15 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar6 * 2 + 2);
          }
        }
        uVar5 = (ulong)skiptable[uVar15 & 0xff];
        if (uVar5 == 0) {
          if ((long)uVar16 < 1) {
            uVar5 = 0;
          }
          else {
            lVar6 = 0;
            psVar9 = psVar8;
            do {
              sVar2 = psVar8[lVar6];
              uVar15 = (uint)(ushort)sVar2;
              if (((psVar12 < psVar9) && (((ushort)sVar2 & 0xfc00) == 0xdc00)) &&
                 ((psVar8[lVar6 + -1] & 0xfc00U) == 0xd800)) {
                uVar15 = (uint)(ushort)sVar2 + (uint)(ushort)psVar8[lVar6 + -1] * 0x400 + 0xfca02400
                ;
              }
              uVar18 = 0xff;
              if (uVar15 < 0x11000) {
                uVar18 = 0x1f;
              }
              uVar3 = uVar15 >> 5;
              if (0x10fff < uVar15) {
                uVar3 = (uVar15 - 0x11000 >> 8) + 0x880;
              }
              sVar11 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar18 & uVar15) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar3 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar18 & uVar15) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2
                            ) * 0x14 + 0xe) & 1) == 0) {
                uVar15 = uVar15 + (int)sVar11;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2) == 1) {
                uVar15 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2 + 2);
              }
              if (uVar15 != local_238[uVar14 + lVar6 + -1]) {
                uVar5 = -lVar6;
                goto LAB_0011ddfd;
              }
              lVar6 = lVar6 + -1;
              psVar9 = psVar9 + -1;
              uVar5 = uVar14;
            } while (-uVar14 != lVar6);
          }
          qVar10 = ((long)psVar8 - (long)psVar12 >> 1) - (uVar14 - 1);
          lVar6 = uVar14 + qVar10;
          if (lVar13 <= (long)(uVar14 + qVar10)) {
            lVar6 = lVar13;
          }
          local_248.m_size = lVar13 - lVar6;
          local_248.m_data = psVar12 + lVar6;
          if (((long)uVar16 < 0x101) ||
             (s.m_size = uVar16 - uVar14, s.m_data = psVar7 + uVar14,
             bVar4 = QStringView::startsWith(&local_248,s,CaseInsensitive), bVar4))
          goto LAB_0011df2c;
          lVar6 = -uVar5;
LAB_0011ddfd:
          psVar9 = psVar8 + lVar6;
          sVar2 = *psVar9;
          uVar15 = (uint)(ushort)sVar2;
          if ((psVar12 < psVar9 && ((ushort)sVar2 & 0xfc00) == 0xdc00) &&
             ((psVar9[-1] & 0xfc00U) == 0xd800)) {
            uVar15 = (uint)(ushort)sVar2 + (uint)(ushort)psVar9[-1] * 0x400 + 0xfca02400;
          }
          uVar18 = 0xff;
          if (uVar15 < 0x11000) {
            uVar18 = 0x1f;
          }
          uVar3 = uVar15 >> 5;
          if (0x10fff < uVar15) {
            uVar3 = (uVar15 - 0x11000 >> 8) + 0x880;
          }
          uVar17 = (uint)(int)(short)*(ushort *)
                                      (QUnicodeTables::uc_properties +
                                      (ulong)*(ushort *)
                                              (QUnicodeTables::uc_property_trie +
                                              (ulong)((uVar18 & uVar15) +
                                                     (uint)*(ushort *)
                                                            (QUnicodeTables::uc_property_trie +
                                                            (ulong)uVar3 * 2)) * 2) * 0x14 + 0xe) >>
                   1;
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar18 & uVar15) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar3 * 2)) * 2) *
                0x14 + 0xe) & 1) == 0) {
            uVar15 = uVar15 + (uVar17 & 0xffff);
          }
          else {
            lVar6 = (long)(short)uVar17;
            if (*(short *)(QUnicodeTables::specialCaseMap + lVar6 * 2) == 1) {
              uVar15 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + lVar6 * 2 + 2);
            }
          }
          uVar5 = uVar14 - uVar5;
          if (skiptable[uVar15 & 0xff] != uVar16) {
            uVar5 = 1;
          }
        }
        bVar4 = psVar8 <= psVar1 + -uVar5;
        psVar8 = psVar8 + uVar5;
      } while (bVar4);
      qVar10 = -1;
    }
  }
LAB_0011df2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar10;
}

Assistant:

static inline qsizetype bm_find(QStringView haystack, qsizetype index, QStringView needle,
                          const uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = haystack.utf16();
    const qsizetype l = haystack.size();
    const char16_t *puc = needle.utf16();
    const qsizetype pl = needle.size();

    if (pl == 0)
        return index > l ? -1 : index;

    if (cs == Qt::CaseSensitive) {
        const qsizetype pl_minus_one = pl - 1;
        const char16_t *current = uc + index + pl_minus_one;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[*current & 0xff];
            if (!skip) {
                // possible match
                while (skip < pl) {
                    if (*(current - skip) != puc[pl_minus_one-skip])
                        break;
                    ++skip;
                }
                if (skip > pl_minus_one) // we have a match
                    return (current - uc) - pl_minus_one;

                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[*(current - skip) & 0xff] == pl)
                    skip = pl - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    } else {
        char16_t foldBuffer[FoldBufferCapacity];
        const qsizetype foldBufferLength = qMin(FoldBufferCapacity, pl);
        const char16_t *start = puc;
        for (qsizetype i = 0; i < foldBufferLength; ++i)
            foldBuffer[i] = foldCase(&puc[i], start);
        QStringView restNeedle = needle.sliced(foldBufferLength);
        const qsizetype foldBufferEnd = foldBufferLength - 1;
        const char16_t *current = uc + index + foldBufferEnd;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[foldCase(current, uc) & 0xff];
            if (!skip) {
                // possible match
                while (skip < foldBufferLength) {
                    if (foldCase(current - skip, uc) != foldBuffer[foldBufferEnd - skip])
                        break;
                    ++skip;
                }
                if (skip > foldBufferEnd) { // Matching foldBuffer
                    qsizetype candidatePos = (current - uc) - foldBufferEnd;
                    QStringView restHaystack =
                            haystack.sliced(qMin(haystack.size(), candidatePos + foldBufferLength));
                    if (restNeedle.size() == 0
                        || restHaystack.startsWith(
                                restNeedle, Qt::CaseInsensitive)) // Check the rest of the string
                        return candidatePos;
                }
                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[foldCase(current - skip, uc) & 0xff] == foldBufferLength)
                    skip = foldBufferLength - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    }
    return -1; // not found
}